

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780SimulationDataGenerator.cpp
# Opt level: O0

void __thiscall HD44780SimulationDataGenerator::Output(HD44780SimulationDataGenerator *this)

{
  int iVar1;
  char local_118 [8];
  char s1 [256];
  HD44780SimulationDataGenerator *this_local;
  
  DoTransfer(this,false,false,'\x01');
  iVar1 = (int)this;
  TimeToSamplesOrMore(this,((double)this->mSettings->mBusyTimeClearHome * 1.25) / 1000000.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  strcpy(local_118,"Hello World");
  DoTransferString(this,false,local_118);
  if (this->mRW != (SimulationChannelDescriptor *)0x0) {
    DoTransfer(this,false,true,'\v');
    TimeToSamplesOrMore(this,((double)this->mSettings->mBusyTimeCmdChar * 1.25) / 1000000.0);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  }
  DoTransfer(this,false,false,0x8f);
  TimeToSamplesOrMore(this,((double)this->mSettings->mBusyTimeCmdChar * 1.25) / 1000000.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  this->value = this->value + 1;
  sprintf(local_118,"%u");
  DoTransferString(this,false,local_118);
  if (this->mRW != (SimulationChannelDescriptor *)0x0) {
    DoTransfer(this,false,false,0x80);
    TimeToSamplesOrMore(this,((double)this->mSettings->mBusyTimeCmdChar * 1.25) / 1000000.0);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
    strcpy(local_118,"Hello");
    DoTransferString(this,true,local_118);
  }
  TimeToSamplesOrMore(this,0.001);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  return;
}

Assistant:

void HD44780SimulationDataGenerator::Output()
{
    char s1[ 256 ];

    // display clear
    DoTransfer( false, false, _BV( LCD_CLR ) );
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeClearHome * ( 1 + TIMING_MARGIN ) / _US ) );

    // write data ("Hello World")
    strcpy( s1, LCD_MESSAGE_WRITE );
    DoTransferString( false, s1 );

    // if (rw) read busy flag/address
    if( mRW != NULL )
    {
        DoTransfer( false, true, strlen( LCD_MESSAGE_WRITE ) );
        mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );
    }

    // set ddram addr 15
    DoTransfer( false, false, _BV( LCD_DDRAM ) | 15 );
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );

    // write data (incrementing integer)
    sprintf( s1, "%u", value++ );
    DoTransferString( false, s1 );

    // if (rw) set ddram addr 0, read 5 characters
    if( mRW != NULL )
    {
        DoTransfer( false, false, _BV( LCD_DDRAM ) );
        mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );

        strcpy( s1, LCD_MESSAGE_READ );
        DoTransferString( true, s1 );
    }

    // delay 1ms
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( 1 / _MS ) );
}